

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlDocCopyNode(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_68;
  PyObject *local_60;
  undefined4 local_54;
  undefined *puStack_50;
  int extended;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  PyObject *pyobj_node;
  xmlNodePtr node;
  xmlNodePtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OOi:xmlDocCopyNode",&doc,&stack0xffffffffffffffb0,&local_54)
  ;
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (doc == (xmlDocPtr)&_Py_NoneStruct) {
      local_60 = (PyObject *)0x0;
    }
    else {
      local_60 = (PyObject *)doc->name;
    }
    pyobj_node = local_60;
    if (puStack_50 == &_Py_NoneStruct) {
      local_68 = (PyObject *)0x0;
    }
    else {
      local_68 = *(PyObject **)(puStack_50 + 0x10);
    }
    pyobj_doc = local_68;
    node = (xmlNodePtr)xmlDocCopyNode(local_60,local_68,local_54);
    self_local = libxml_xmlNodePtrWrap(node);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlDocCopyNode(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlNodePtr c_retval;
    xmlNodePtr node;
    PyObject *pyobj_node;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    int extended;

    if (!PyArg_ParseTuple(args, (char *)"OOi:xmlDocCopyNode", &pyobj_node, &pyobj_doc, &extended))
        return(NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);

    c_retval = xmlDocCopyNode(node, doc, extended);
    py_retval = libxml_xmlNodePtrWrap((xmlNodePtr) c_retval);
    return(py_retval);
}